

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyDefinition::ParseValue(PropertyDefinition *this,Property *property,String *value)

{
  PropertyParser *pPVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_30;
  size_t i;
  String *value_local;
  Property *property_local;
  PropertyDefinition *this_local;
  
  local_30 = 0;
  while( true ) {
    sVar3 = ::std::
            vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
            ::size(&this->parsers);
    if (sVar3 <= local_30) {
      property->unit = UNKNOWN;
      return false;
    }
    pvVar4 = ::std::
             vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ::operator[](&this->parsers,local_30);
    pPVar1 = pvVar4->parser;
    pvVar4 = ::std::
             vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
             ::operator[](&this->parsers,local_30);
    uVar2 = (*pPVar1->_vptr_PropertyParser[2])(pPVar1,property,value,&pvVar4->parameters);
    if ((uVar2 & 1) != 0) break;
    local_30 = local_30 + 1;
  }
  property->definition = this;
  property->parser_index = (int)local_30;
  return true;
}

Assistant:

bool PropertyDefinition::ParseValue(Property& property, const String& value) const
{
	for (size_t i = 0; i < parsers.size(); i++)
	{
		if (parsers[i].parser->ParseValue(property, value, parsers[i].parameters))
		{
			property.definition = this;
			property.parser_index = (int)i;
			return true;
		}
	}

	property.unit = Unit::UNKNOWN;
	return false;
}